

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O0

void * __thiscall StackSym::GetConstAddress(StackSym *this,bool useLocal)

{
  StackSym *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  AddrOpnd *pAVar6;
  Var local_40;
  StackSym *stackSym;
  Opnd *src1;
  Instr *defInstr;
  bool useLocal_local;
  StackSym *this_local;
  
  bVar3 = IsConst(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x292,"(this->IsConst())","this->IsConst()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  src1 = (Opnd *)(this->field_5).m_instrDef;
  stackSym = (StackSym *)IR::Instr::GetSrc1((Instr *)src1);
  bVar3 = IR::Opnd::IsRegOpnd((Opnd *)stackSym);
  if (bVar3) {
    pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)stackSym);
    pSVar1 = pRVar5->m_sym;
    if ((*(uint *)&pSVar1->field_0x18 >> 6 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0x29b,"(!stackSym->m_isEncodedConstant)","!stackSym->m_isEncodedConstant")
      ;
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if ((*(uint *)&pSVar1->field_0x18 & 1) != 0) {
      src1 = (Opnd *)(pSVar1->field_5).m_instrDef;
      stackSym = (StackSym *)IR::Instr::GetSrc1((Instr *)src1);
    }
  }
  bVar3 = IR::Opnd::IsAddrOpnd((Opnd *)stackSym);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x2a4,"(src1->IsAddrOpnd())","src1->IsAddrOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((((*(short *)&src1[3]._vptr_Opnd != 0x45) && (*(short *)&src1[3]._vptr_Opnd != 0x226)) &&
      (*(short *)&src1[3]._vptr_Opnd != 0x1ee)) &&
     (bVar3 = LowererMD::IsAssign((Instr *)src1), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x2a5,
                       "(defInstr->m_opcode == Js::OpCode::Ld_A || defInstr->m_opcode == Js::OpCode::LdStr || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr))"
                       ,
                       "defInstr->m_opcode == Js::OpCode::Ld_A || defInstr->m_opcode == Js::OpCode::LdStr || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr)"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (useLocal) {
    pAVar6 = IR::Opnd::AsAddrOpnd((Opnd *)stackSym);
    local_40 = pAVar6->m_localAddress;
  }
  else {
    pAVar6 = IR::Opnd::AsAddrOpnd((Opnd *)stackSym);
    local_40 = pAVar6->m_address;
  }
  return local_40;
}

Assistant:

void *StackSym::GetConstAddress(bool useLocal /*= false*/) const
{
    Assert(this->IsConst());
    IR::Instr *defInstr = this->m_instrDef;
    IR::Opnd *src1 = defInstr->GetSrc1();

    StackSym * stackSym = nullptr;

    if (src1->IsRegOpnd())
    {
        stackSym = src1->AsRegOpnd()->m_sym;
        Assert(!stackSym->m_isEncodedConstant);
        if (stackSym->m_isSingleDef)
        {
            //In ARM constant load is always legalized. Try to get the constant from src def
            defInstr = stackSym->m_instrDef;
            src1 = defInstr->GetSrc1();
        }
    }

    Assert(src1->IsAddrOpnd());
    Assert(defInstr->m_opcode == Js::OpCode::Ld_A || defInstr->m_opcode == Js::OpCode::LdStr || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr));
    return useLocal ? src1->AsAddrOpnd()->m_localAddress : src1->AsAddrOpnd()->m_address;
}